

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

thousands_sep_result<char> * fmt::v9::detail::thousands_sep_impl<char>(locale_ref loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char cVar3;
  numpunct *pnVar4;
  thousands_sep_result<char> *in_RDI;
  string grouping;
  locale local_40;
  size_type local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  facet **ppfStack_28;
  
  locale_ref::get<std::locale>((locale_ref *)&local_40);
  pnVar4 = std::use_facet<std::__cxx11::numpunct<char>>(&local_40);
  std::locale::~locale(&local_40);
  (**(code **)(*(long *)pnVar4 + 0x20))(&local_40,pnVar4);
  if (local_38 == 0) {
    cVar3 = '\0';
  }
  else {
    cVar3 = (**(code **)(*(long *)pnVar4 + 0x18))(pnVar4);
  }
  sVar2 = local_38;
  paVar1 = &(in_RDI->grouping).field_2;
  (in_RDI->grouping)._M_dataplus._M_p = (pointer)paVar1;
  if (local_40._M_impl == (_Impl *)&local_30) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_2f,local_30);
    *(facet ***)((long)&(in_RDI->grouping).field_2 + 8) = ppfStack_28;
  }
  else {
    (in_RDI->grouping)._M_dataplus._M_p = (pointer)local_40._M_impl;
    (in_RDI->grouping).field_2._M_allocated_capacity = CONCAT71(uStack_2f,local_30);
  }
  local_38 = 0;
  (in_RDI->grouping)._M_string_length = sVar2;
  local_30 = 0;
  in_RDI->thousands_sep = cVar3;
  local_40._M_impl = (_Impl *)&local_30;
  std::__cxx11::string::~string((string *)&local_40);
  return in_RDI;
}

Assistant:

FMT_FUNC auto thousands_sep_impl(locale_ref loc) -> thousands_sep_result<Char> {
  auto& facet = std::use_facet<std::numpunct<Char>>(loc.get<std::locale>());
  auto grouping = facet.grouping();
  auto thousands_sep = grouping.empty() ? Char() : facet.thousands_sep();
  return {std::move(grouping), thousands_sep};
}